

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O3

void __thiscall OpenMD::SelectionEvaluator::predefine(SelectionEvaluator *this,string *script)

{
  size_type *psVar1;
  pointer pTVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  bool bVar5;
  long *plVar6;
  undefined8 *puVar7;
  ulong *puVar8;
  undefined8 uVar9;
  pointer pTVar10;
  _Alloc_hider _Var11;
  string variable;
  vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> statement;
  vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
  aatoken;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [32];
  _Storage local_48;
  long local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  paVar3 = &local_b8.first.field_2;
  local_b8.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"#predefine","");
  bVar5 = SelectionCompiler::compile(&this->compiler,&local_b8.first,script);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_b8.first._M_dataplus._M_p,local_b8.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (!bVar5) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48,
                   "predefined set compile error:",script);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_48);
    paVar4 = &local_88.field_2;
    puVar8 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_88.field_2._M_allocated_capacity = *puVar8;
      local_88.field_2._8_8_ = plVar6[3];
      local_88._M_dataplus._M_p = (pointer)paVar4;
    }
    else {
      local_88.field_2._M_allocated_capacity = *puVar8;
      local_88._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_88._M_string_length = plVar6[1];
    *plVar6 = (long)puVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    SelectionCompiler::getErrorMessage_abi_cxx11_((string *)local_68,&this->compiler);
    pTVar2 = (pointer)((long)(int *)local_68._8_8_ + local_88._M_string_length);
    uVar9 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar4) {
      uVar9 = local_88.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < pTVar2) {
      pTVar10 = (pointer)0xf;
      if ((pointer)local_68._0_8_ != (pointer)(local_68 + 0x10)) {
        pTVar10 = (pointer)local_68._16_8_;
      }
      if (pTVar2 <= pTVar10) {
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)local_68,0,(char *)0x0,(ulong)local_88._M_dataplus._M_p);
        goto LAB_00264107;
      }
    }
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_88,local_68._0_8_);
LAB_00264107:
    psVar1 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar1) {
      local_b8.first.field_2._M_allocated_capacity = *psVar1;
      local_b8.first.field_2._8_4_ = *(undefined4 *)(puVar7 + 3);
      local_b8.first.field_2._12_4_ = *(undefined4 *)((long)puVar7 + 0x1c);
      local_b8.first._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_b8.first.field_2._M_allocated_capacity = *psVar1;
      local_b8.first._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_b8.first._M_string_length = puVar7[1];
    *puVar7 = psVar1;
    puVar7[1] = 0;
    *(undefined1 *)psVar1 = 0;
    snprintf(painCave.errMsg,2000,"SelectionEvaluator Error: %s\n",local_b8.first._M_dataplus._M_p);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.first._M_dataplus._M_p != paVar3) {
      operator_delete(local_b8.first._M_dataplus._M_p,
                      local_b8.first.field_2._M_allocated_capacity + 1);
    }
    if ((pointer)local_68._0_8_ != (pointer)(local_68 + 0x10)) {
      operator_delete((void *)local_68._0_8_,(ulong)(local_68._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar4) {
      operator_delete(local_88._M_dataplus._M_p,(ulong)(local_88.field_2._M_allocated_capacity + 1))
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_ptr != &local_38) {
      operator_delete(local_48._M_ptr,local_38._M_allocated_capacity + 1);
    }
    return;
  }
  std::
  vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
  ::vector((vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
            *)&local_48,&(this->compiler).aatokenCompiled);
  if (local_40 - (long)local_48 != 0x18) {
    std::operator+(&local_b8.first,"predefinition does not have exactly 1 command:",script);
    snprintf(painCave.errMsg,2000,"SelectionEvaluator Error: %s\n",local_b8.first._M_dataplus._M_p);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.first._M_dataplus._M_p != paVar3) {
      operator_delete(local_b8.first._M_dataplus._M_p,
                      local_b8.first.field_2._M_allocated_capacity + 1);
    }
    goto LAB_00264259;
  }
  std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::vector
            ((vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *)local_68,
             (vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *)local_48._M_ptr);
  if ((ulong)(((long)(local_68._8_8_ - local_68._0_8_) >> 3) * -0x5555555555555555) < 3) {
    std::operator+(&local_b8.first,"bad predefinition length:",script);
    snprintf(painCave.errMsg,2000,"SelectionEvaluator Error: %s\n",local_b8.first._M_dataplus._M_p);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
LAB_00264239:
    _Var11._M_p = local_b8.first._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.first._M_dataplus._M_p != paVar3) {
LAB_00264247:
      operator_delete(_Var11._M_p,local_b8.first.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (((pointer)(local_68._0_8_ + 0x18))->tok != 1 &&
        (~((pointer)(local_68._0_8_ + 0x18))->tok & 0x4400U) != 0) {
      std::operator+(&local_b8.first,"invalid variable name:",script);
      snprintf(painCave.errMsg,2000,"SelectionEvaluator Error: %s\n",local_b8.first._M_dataplus._M_p
              );
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
      goto LAB_00264239;
    }
    plVar6 = (long *)std::__any_caster<std::__cxx11::string>((any *)(local_68._0_8_ + 0x20));
    if (plVar6 == (long *)0x0) {
      std::__throw_bad_any_cast();
    }
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_88,*plVar6,plVar6[1] + *plVar6);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_&,_true>
              (&local_b8,&local_88,(vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *)local_68
              );
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::any>,std::_Select1st<std::pair<std::__cxx11::string_const,std::any>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::any>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::any>,std::_Select1st<std::pair<std::__cxx11::string_const,std::any>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
                *)&this->variables,&local_b8);
    if (local_b8.second._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      (*local_b8.second._M_manager)(_Op_destroy,&local_b8.second,(_Arg *)0x0);
      local_b8.second._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.first._M_dataplus._M_p != paVar3) {
      operator_delete(local_b8.first._M_dataplus._M_p,
                      local_b8.first.field_2._M_allocated_capacity + 1);
    }
    local_b8.first.field_2._M_allocated_capacity = local_88.field_2._M_allocated_capacity;
    _Var11._M_p = local_88._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) goto LAB_00264247;
  }
  std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::~vector
            ((vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *)local_68);
LAB_00264259:
  std::
  vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
  ::~vector((vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
             *)&local_48);
  return;
}

Assistant:

void SelectionEvaluator::predefine(const std::string& script) {
    if (compiler.compile("#predefine", script)) {
      std::vector<std::vector<Token>> aatoken = compiler.getAatokenCompiled();
      if (aatoken.size() != 1) {
        evalError("predefinition does not have exactly 1 command:" + script);
        return;
      }
      std::vector<Token> statement = aatoken[0];
      if (statement.size() > 2) {
        int tok = statement[1].tok;
        if (tok == Token::identifier ||
            (tok & Token::predefinedset) == Token::predefinedset) {
          std::string variable = std::any_cast<std::string>(statement[1].value);
          variables.insert(VariablesType::value_type(variable, statement));

        } else {
          evalError("invalid variable name:" + script);
        }
      } else {
        evalError("bad predefinition length:" + script);
      }

    } else {
      evalError("predefined set compile error:" + script +
                "\ncompile error:" + compiler.getErrorMessage());
    }
  }